

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O2

void spell_dark_vessel(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  OBJ_DATA *arg1;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  char *txt;
  allocator<char> local_186;
  allocator<char> local_185;
  int local_184;
  void *local_180;
  void *local_178;
  CHAR_DATA *ch_local;
  OBJ_DATA *corpse;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  ch_local = ch;
  pOVar2 = find_urn(ch);
  arg1 = get_obj_here(ch,target_name);
  corpse = arg1;
  if (pOVar2 == (OBJ_DATA *)0x0) {
    if (arg1 != (OBJ_DATA *)0x0) goto LAB_00350207;
  }
  else {
    if ((int)arg1->level <= pOVar2->value[3]) {
      txt = "You already have a dark vessel in your possession.\n\r";
      goto LAB_00350265;
    }
LAB_00350207:
    bVar1 = str_cmp(target_name,"");
    if (bVar1) {
      if (((ushort)((short)*(undefined4 *)&arg1->item_type - 0x17U) < 2) &&
         ((arg1->wear_flags[0] & 0x8000000) == 0)) {
        if (ch->level + -9 <= (int)arg1->level) {
          if (pOVar2 == (OBJ_DATA *)0x0) {
            pObjIndex = get_obj_index(0xb72);
            obj = create_object(pObjIndex,0);
            if (obj == (OBJ_DATA *)0x0) {
              return;
            }
            obj->level = ch->level;
            obj->value[3] = (int)arg1->level;
            obj->value[4] = 0;
            obj_to_char(obj,ch);
          }
          else {
            pOVar2->level = ch->level;
            pOVar2->value[3] = (int)arg1->level;
          }
          *(byte *)(arg1->wear_flags + 1) = (byte)arg1->wear_flags[1] | 1;
          *(byte *)arg1->wear_flags = (byte)arg1->wear_flags[0] & 0xfe;
          WAIT_STATE(ch,0x18);
          act("$n plunges a hand into $p\'s chest cavity, and removes the heart.",ch,arg1,
              (void *)0x0,0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"spell_dark_vessel",&local_185);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,"act_queue",&local_186);
          local_178 = (void *)0x0;
          local_180 = (void *)0x0;
          local_184 = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (&RS.Queue,2,&local_40,&local_60,act_queue,
                     (char (*) [57])"$n holds the heart aloft as it visibly begins to harden.",
                     &ch_local,&local_178,&local_180,&local_184);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_40);
          send_to_char("You remove the corpse\'s heart and squeeze the blood out of it, hardening it into a solid object.\n\r"
                       ,ch_local);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"spell_dark_vessel",(allocator<char> *)&local_178);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"make_urn",(allocator<char> *)&local_180);
          CQueue::AddToQueue<void(*)(char_data*,obj_data*),char_data*&,obj_data*&>
                    (&RS.Queue,4,&local_80,&local_a0,make_urn,&ch_local,&corpse);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
          if (pOVar2 != (OBJ_DATA *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"spell_dark_vessel",(allocator<char> *)&local_178);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e0,"send_to_char_queue",(allocator<char> *)&local_180);
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[173],char_data*&>
                      (&RS.Queue,6,&local_c0,&local_e0,send_to_char_queue,
                       (char (*) [173])
                       "You drink the remaining blood from your old vessel, expelling each drop into the new one as your body convulses!\n\r The old vessel drops from your hand as it turns to ash.\n\r"
                       ,&ch_local);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"spell_dark_vessel",&local_185);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"act_queue",&local_186);
            local_178 = (void *)0x0;
            local_180 = (void *)0x0;
            local_184 = 0;
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[121],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      (&RS.Queue,7,&local_100,&local_120,act_queue,
                       (char (*) [121])
                       "$n drinks a thick fluid from a sanguine object and begins convulsing as they expel the fluid into the newly made vessel!"
                       ,&ch_local,&local_178,&local_180,&local_184);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,"spell_dark_vessel",&local_185);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_160,"act_queue",&local_186);
            local_178 = (void *)0x0;
            local_180 = (void *)0x0;
            local_184 = 0;
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[63],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      (&RS.Queue,8,&local_140,&local_160,act_queue,
                       (char (*) [63])
                       "$n shudders, releasing the sanguine object as it turns to ash.",&ch_local,
                       &local_178,&local_180,&local_184);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_140);
          }
          return;
        }
        txt = "That corpse isn\'t powerful enough to contain your dark energies.\n\r";
      }
      else {
        txt = "That wouldn\'t be a suitable dark vessel.\n\r";
      }
      goto LAB_00350265;
    }
  }
  txt = "You fail to select a corpse and waste your dark energies.\n\r";
LAB_00350265:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_dark_vessel(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *urn, *corpse;

	urn = find_urn(ch);
	corpse = get_obj_here(ch, target_name);
	
	if (urn != nullptr && urn->value[3] >= corpse->level)
	{
		send_to_char("You already have a dark vessel in your possession.\n\r", ch);
		return;	
	}


	if (!corpse || !str_cmp(target_name, ""))
	{
		send_to_char("You fail to select a corpse and waste your dark energies.\n\r", ch);
		return;
	}

	if ((corpse->item_type != ITEM_CORPSE_PC && corpse->item_type != ITEM_CORPSE_NPC)
		|| IS_SET(corpse->wear_flags, CORPSE_NO_ANIMATE))
	{
		send_to_char("That wouldn't be a suitable dark vessel.\n\r", ch);
		return;
	}

	if (corpse->level < (ch->level - 9))
	{
		send_to_char("That corpse isn't powerful enough to contain your dark energies.\n\r", ch);
		return;
	}

	bool isNewUrn = false;
	if(urn == nullptr)
	{
		urn = create_object(get_obj_index(OBJ_VNUM_URN), 0);
		if (!urn) // something went wrong, stop the creation
			return;
		
		isNewUrn = true;
	}


	urn->level = ch->level;
	urn->value[3] = corpse->level;

	if(isNewUrn)
	{
		urn->value[4] = 0;
		obj_to_char(urn, ch);
	}

	SET_BIT(corpse->wear_flags, ITEM_NO_SAC);
	REMOVE_BIT(corpse->wear_flags, ITEM_TAKE);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);

	act("$n plunges a hand into $p's chest cavity, and removes the heart.", ch, corpse, 0, TO_ROOM);

	RS.Queue.AddToQueue(2, "spell_dark_vessel", "act_queue", act_queue, "$n holds the heart aloft as it visibly begins to harden.", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You remove the corpse's heart and squeeze the blood out of it, hardening it into a solid object.\n\r", ch);

	RS.Queue.AddToQueue(4, "spell_dark_vessel", "make_urn", make_urn, ch, corpse);
	
	if(isNewUrn == false)
	{
		RS.Queue.AddToQueue(6, "spell_dark_vessel", "send_to_char_queue", send_to_char_queue, "You drink the remaining blood from your old vessel, expelling each drop into the new one as your body convulses!\n\r The old vessel drops from your hand as it turns to ash.\n\r", ch);
		RS.Queue.AddToQueue(7, "spell_dark_vessel", "act_queue", act_queue, "$n drinks a thick fluid from a sanguine object and begins convulsing as they expel the fluid into the newly made vessel!", ch, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "spell_dark_vessel", "act_queue", act_queue, "$n shudders, releasing the sanguine object as it turns to ash.", ch, nullptr, nullptr, TO_ROOM);
	}
}